

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int asl::utf16toLocal8(wchar_t *p,char *u,int n)

{
  size_t sVar1;
  
  sVar1 = wcstombs(u,p,(long)(n + 1));
  return (int)sVar1;
}

Assistant:

int utf16toLocal8(const wchar_t* p, char* u, int n)
{
#ifdef _WIN32
	char def = '_';
	BOOL used = false;
	return WideCharToMultiByte(CP_ACP, 0, p, -1, u, n + 1, &def, &used) - 1;
#else
	return (int)wcstombs(u, p, n + 1);
#endif
}